

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.cpp
# Opt level: O0

void __thiscall Span::Span(Span *this,void *sa,int s,int n,int a,int sc,int es)

{
  int sc_local;
  int a_local;
  int n_local;
  int s_local;
  void *sa_local;
  Span *this_local;
  
  this->allocCount = a;
  this->nelems = n;
  this->startAddr = sa;
  this->size = s;
  BitMap::BitMap(&this->bitmap,n);
  this->spanClass = sc;
  this->elemsize = es;
  return;
}

Assistant:

Span::Span(void *sa, int s, int n, int a, int sc, int es)
    : startAddr(sa), size(s), nelems(n), allocCount(a), spanClass(sc),
      elemsize(es), bitmap(n) {}